

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O2

void __thiscall XMISong::ProcessInitialMetaEvents(XMISong *this)

{
  BYTE BVar1;
  TrackInfo *this_00;
  DWORD DVar2;
  size_t sVar3;
  size_t sVar4;
  
  this_00 = this->CurrSong;
  sVar4 = this_00->EventLen;
  sVar3 = this_00->EventP;
  while (((this_00->Finished == false && (sVar3 < sVar4 - 3)) &&
         (this_00->EventChunk[sVar3] == 0xff))) {
    BVar1 = this_00->EventChunk[sVar3 + 1];
    this_00->EventP = sVar3 + 2;
    DVar2 = TrackInfo::ReadVarLen(this_00);
    sVar3 = (ulong)DVar2 + this_00->EventP;
    sVar4 = this_00->EventLen;
    if ((sVar3 <= sVar4) && (BVar1 == '/')) {
      this_00->Finished = true;
    }
    this_00->EventP = sVar3;
  }
  if (sVar4 - 1 <= sVar3) {
    this_00->Finished = true;
  }
  return;
}

Assistant:

void XMISong::ProcessInitialMetaEvents ()
{
	TrackInfo *track = CurrSong;
	BYTE event;
	DWORD len;

	while (!track->Finished &&
			track->EventP < track->EventLen - 3 &&
			track->EventChunk[track->EventP] == MIDI_META)
	{
		event = track->EventChunk[track->EventP+1];
		track->EventP += 2;
		len = track->ReadVarLen();
		if (track->EventP + len <= track->EventLen && event == MIDI_META_EOT)
		{
			track->Finished = true;
		}
		track->EventP += len;
	}
	if (track->EventP >= track->EventLen - 1)
	{
		track->Finished = true;
	}
}